

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_pcm_interleave_s32(void *dst,void **src,ma_uint64 frameCount,ma_uint32 channels)

{
  ma_int32 *dst_s32;
  ma_uint64 mVar1;
  ma_uint32 iChannel;
  ulong uVar2;
  
  for (mVar1 = 0; mVar1 != frameCount; mVar1 = mVar1 + 1) {
    for (uVar2 = 0; channels != uVar2; uVar2 = uVar2 + 1) {
      *(undefined4 *)((long)dst + uVar2 * 4) = *(undefined4 *)((long)src[uVar2] + mVar1 * 4);
    }
    dst = (void *)((long)dst + (ulong)channels * 4);
  }
  return;
}

Assistant:

MA_API void ma_pcm_interleave_s32(void* dst, const void** src, ma_uint64 frameCount, ma_uint32 channels)
{
#ifdef MA_USE_REFERENCE_CONVERSION_APIS
    ma_pcm_interleave_s32__reference(dst, src, frameCount, channels);
#else
    ma_pcm_interleave_s32__optimized(dst, src, frameCount, channels);
#endif
}